

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

bool * __thiscall
google::protobuf::RepeatedField<bool>::Mutable(RepeatedField<bool> *this,int index)

{
  bool *pbVar1;
  int in_ESI;
  RepeatedField<bool> *in_stack_ffffffffffffffa0;
  
  pbVar1 = elements(in_stack_ffffffffffffffa0);
  return pbVar1 + in_ESI;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}